

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.cpp
# Opt level: O3

int __thiscall dlib::file::init(file *this,EVP_PKEY_CTX *ctx)

{
  string *psVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  error *peVar5;
  stat64 buffer;
  char buf [4096];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_10e8;
  stat64 local_10c8;
  char local_1038 [4104];
  
  pcVar3 = realpath(*(char **)ctx,local_1038);
  if (pcVar3 == (char *)0x0) {
    peVar5 = (error *)__cxa_allocate_exception(0x30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_10c8,
                   "Unable to find file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx);
    error::error(peVar5,(string *)&local_10c8);
    *(undefined ***)peVar5 = &PTR__error_0030fda8;
    __cxa_throw(peVar5,&file_not_found::typeinfo,error::~error);
  }
  psVar1 = &(this->state).full_name;
  pcVar3 = (char *)(this->state).full_name._M_string_length;
  strlen(local_1038);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar3,(ulong)local_1038);
  lVar4 = std::__cxx11::string::rfind((char)psVar1,0x2f);
  if (lVar4 != -1) {
    std::__cxx11::string::substr((ulong)&local_10c8,(ulong)psVar1);
    std::__cxx11::string::operator=((string *)&(this->state).name,(string *)&local_10c8);
    if ((__nlink_t *)local_10c8.st_dev != &local_10c8.st_nlink) {
      operator_delete((void *)local_10c8.st_dev);
    }
    iVar2 = stat64((psVar1->_M_dataplus)._M_p,&local_10c8);
    if ((iVar2 == 0) && ((local_10c8.st_mode & 0xf000) != 0x4000)) {
      (this->state).file_size = local_10c8.st_size;
      (this->state).last_modified.__d.__r = local_10c8.st_mtim.tv_sec * 1000000000;
      return (int)(local_10c8.st_mtim.tv_sec * 1000000000);
    }
    peVar5 = (error *)__cxa_allocate_exception(0x30);
    std::operator+(&bStack_10e8,"Unable to find file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx);
    error::error(peVar5,&bStack_10e8);
    *(undefined ***)peVar5 = &PTR__error_0030fda8;
    __cxa_throw(peVar5,&file_not_found::typeinfo,error::~error);
  }
  peVar5 = (error *)__cxa_allocate_exception(0x30);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_10c8,
                 "Unable to find file ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx);
  error::error(peVar5,(string *)&local_10c8);
  *(undefined ***)peVar5 = &PTR__error_0030fda8;
  __cxa_throw(peVar5,&file_not_found::typeinfo,error::~error);
}

Assistant:

void file::
    init (
        const std::string& name
    )
    {
        using namespace std;



        char buf[PATH_MAX];
        if (realpath(name.c_str(),buf) == 0)
        {
            // the file was not found
            throw file_not_found("Unable to find file " + name);
        }
        state.full_name = buf;


        string::size_type pos = state.full_name.find_last_of(directory::get_separator());
        if (pos == string::npos)
        {
            // no valid full path has no separtor characters.  
            throw file_not_found("Unable to find file " + name);
        }
        state.name = state.full_name.substr(pos+1);


        // now find the size of this file
        struct stat64 buffer;
        if (::stat64(state.full_name.c_str(), &buffer) ||
            S_ISDIR(buffer.st_mode))
        {
            // there was an error during the call to stat64 or
            // name is actually a directory
            throw file_not_found("Unable to find file " + name);
        }
        else
        {
            state.file_size = static_cast<uint64>(buffer.st_size);


            state.last_modified = std::chrono::system_clock::from_time_t(buffer.st_mtime);
#ifdef _BSD_SOURCE 
            state.last_modified += std::chrono::nanoseconds(buffer.st_atim.tv_nsec);
#endif
        }

    }